

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

FxExpression * __thiscall FxMemberIdentifier::Resolve(FxMemberIdentifier *this,FCompileContext *ctx)

{
  FxExpression **object;
  FScriptPosition *this_00;
  PType *this_01;
  bool bVar1;
  int iVar2;
  PStruct *pPVar3;
  undefined4 extraout_var;
  DObject *this_02;
  FxExpression *pFVar4;
  PStruct *classctx;
  FName local_34;
  FName local_30;
  FName local_2c;
  
  if ((this->super_FxIdentifier).super_FxExpression.isresolved != false) {
    return (FxExpression *)this;
  }
  (this->super_FxIdentifier).super_FxExpression.isresolved = true;
  object = &this->Object;
  pFVar4 = this->Object;
  if (pFVar4->ExprType == EFX_Identifier) {
    local_2c.Index = *(int *)&pFVar4[1]._vptr_FxExpression;
    pPVar3 = FindStructType(&local_2c);
    pFVar4 = *object;
    if (pPVar3 == (PStruct *)0x0) {
      if (pFVar4 == (FxExpression *)0x0) goto LAB_00512dcf;
      goto LAB_00512bf6;
    }
    *(undefined1 *)((long)&pFVar4[1]._vptr_FxExpression + 4) = 1;
  }
  else {
LAB_00512bf6:
    pPVar3 = (PStruct *)0x0;
  }
  iVar2 = (*pFVar4->_vptr_FxExpression[2])(pFVar4,ctx);
  *object = (FxExpression *)CONCAT44(extraout_var,iVar2);
  if ((FxExpression *)CONCAT44(extraout_var,iVar2) != (FxExpression *)0x0) {
    FName::FName(&local_30,"allmap");
    if (((pPVar3 != (PStruct *)0x0) && (this->Object->ValueType == &TypeError->super_PType)) &&
       ((bVar1 = DObject::IsKindOf((DObject *)pPVar3,PClass::RegistrationInfo.MyClass), !bVar1 ||
        (*(char *)((long)&pPVar3[1].super_PNamedType.super_PCompoundType.super_PType.HashNext + 1)
         == '\x01')))) {
      local_34.Index = (this->super_FxIdentifier).Identifier.Index;
      this_02 = (DObject *)
                PSymbolTable::FindSymbol
                          (&(pPVar3->super_PNamedType).super_PCompoundType.super_PType.Symbols,
                           &local_34,true);
      if (this_02 != (DObject *)0x0) {
        bVar1 = DObject::IsKindOf(this_02,PSymbolConst::RegistrationInfo.MyClass);
        this_00 = &(this->super_FxIdentifier).super_FxExpression.ScriptPosition;
        if (bVar1) {
          FScriptPosition::Message
                    (this_00,8,"Resolving name \'%s.%s\' as constant\n",
                     FName::NameData.NameArray[(pPVar3->super_PNamedType).TypeName.Index].Text,
                     FName::NameData.NameArray[(this->super_FxIdentifier).Identifier.Index].Text);
          (*(this->super_FxIdentifier).super_FxExpression._vptr_FxExpression[1])(this);
          pFVar4 = FxConstant::MakeConstant((PSymbol *)this_02,this_00);
          return pFVar4;
        }
        FScriptPosition::Message
                  (this_00,2,"Unable to access \'%s.%s\' in a static context\n",
                   FName::NameData.NameArray[(pPVar3->super_PNamedType).TypeName.Index].Text,
                   FName::NameData.NameArray[(this->super_FxIdentifier).Identifier.Index].Text);
        goto LAB_00512dcf;
      }
    }
    this_01 = (*object)->ValueType;
    if (this_01 == (PType *)TypeColor) {
      (*object)->ValueType = (PType *)TypeColorStruct;
    }
    else {
      bVar1 = DObject::IsKindOf((DObject *)this_01,PPointer::RegistrationInfo.MyClass);
      if (bVar1) {
        pPVar3 = (PStruct *)(*object)->ValueType[1].super_PTypeBase.super_DObject._vptr_DObject;
        bVar1 = DObject::IsKindOf((DObject *)pPVar3,PStruct::RegistrationInfo.MyClass);
        if (bVar1) {
          classctx = ctx->Class;
LAB_00512d8d:
          pFVar4 = FxIdentifier::ResolveMember(&this->super_FxIdentifier,ctx,classctx,object,pPVar3)
          ;
          (*(this->super_FxIdentifier).super_FxExpression._vptr_FxExpression[1])(this);
          return pFVar4;
        }
      }
      else {
        bVar1 = DObject::IsKindOf((DObject *)(*object)->ValueType,PStruct::RegistrationInfo.MyClass)
        ;
        if (bVar1) {
          classctx = ctx->Class;
          pPVar3 = (PStruct *)this->Object->ValueType;
          goto LAB_00512d8d;
        }
      }
    }
    FScriptPosition::Message
              (&(this->super_FxIdentifier).super_FxExpression.ScriptPosition,2,
               "Left side of %s is not a struct or class",
               FName::NameData.NameArray[(this->super_FxIdentifier).Identifier.Index].Text);
  }
LAB_00512dcf:
  (*(this->super_FxIdentifier).super_FxExpression._vptr_FxExpression[1])(this);
  return (FxExpression *)0x0;
}

Assistant:

FxExpression *FxMemberIdentifier::Resolve(FCompileContext& ctx)
{
	PStruct *ccls = nullptr;
	CHECKRESOLVED();

	if (Object->ExprType == EFX_Identifier)
	{
		// If the left side is a class name for a static member function call it needs to be resolved manually 
		// because the resulting value type would cause problems in nearly every other place where identifiers are being used.
		ccls = FindStructType(static_cast<FxIdentifier *>(Object)->Identifier);
		if (ccls != nullptr) static_cast<FxIdentifier *>(Object)->noglobal = true;
	}

	SAFE_RESOLVE(Object, ctx);

	if (Identifier == FName("allmap"))
	{
		int a = 2;
	}

	// check for class or struct constants if the left side is a type name.
	if (Object->ValueType == TypeError)
	{
		if (ccls != nullptr)
		{
			if (!ccls->IsKindOf(RUNTIME_CLASS(PClass)) || static_cast<PClass *>(ccls)->bExported)
			{
				PSymbol *sym;
				if ((sym = ccls->Symbols.FindSymbol(Identifier, true)) != nullptr)
				{
					if (sym->IsKindOf(RUNTIME_CLASS(PSymbolConst)))
					{
						ScriptPosition.Message(MSG_DEBUGLOG, "Resolving name '%s.%s' as constant\n", ccls->TypeName.GetChars(), Identifier.GetChars());
						delete this;
						return FxConstant::MakeConstant(sym, ScriptPosition);
					}
					else
					{
						ScriptPosition.Message(MSG_ERROR, "Unable to access '%s.%s' in a static context\n", ccls->TypeName.GetChars(), Identifier.GetChars());
						delete this;
						return nullptr;
					}
				}
			}
		}
	}

	// allow accessing the color channels by mapping the type to a matching struct which defines them.
	if (Object->ValueType == TypeColor)
	{
		Object->ValueType = TypeColorStruct;
	}

	else if (Object->ValueType->IsKindOf(RUNTIME_CLASS(PPointer)))
	{
		auto ptype = static_cast<PPointer *>(Object->ValueType)->PointedType;
		if (ptype->IsKindOf(RUNTIME_CLASS(PStruct)))
		{
			auto ret = ResolveMember(ctx, ctx.Class, Object, static_cast<PStruct *>(ptype));
			delete this;
			return ret;
		}
	}
	else if (Object->ValueType->IsKindOf(RUNTIME_CLASS(PStruct)))
	{
		auto ret = ResolveMember(ctx, ctx.Class, Object, static_cast<PStruct *>(Object->ValueType));
		delete this;
		return ret;
	}

	ScriptPosition.Message(MSG_ERROR, "Left side of %s is not a struct or class", Identifier.GetChars());
	delete this;
	return nullptr;
}